

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFDofsImport.cpp
# Opt level: O2

bool iDynTree::dofsListFromURDF
               (string *urdf_filename,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *dofs)

{
  char cVar1;
  bool bVar2;
  ostream *poVar3;
  string xml_string;
  ifstream ifs;
  undefined8 auStack_130 [36];
  
  std::ifstream::ifstream(&ifs,(urdf_filename->_M_dataplus)._M_p,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "[ERROR] iDynTree::dofsFromURDF : error opening file ");
    poVar3 = std::operator<<(poVar3,(string *)urdf_filename);
    std::endl<char,std::char_traits<char>>(poVar3);
    bVar2 = false;
  }
  else {
    xml_string._M_dataplus._M_p = (pointer)&xml_string.field_2;
    std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)&xml_string,*(undefined8 *)((long)auStack_130 + *(long *)(_ifs + -0x18)),
               0xffffffffffffffff,0,0xffffffff);
    bVar2 = dofsListFromURDFString(&xml_string,dofs);
    std::__cxx11::string::~string((string *)&xml_string);
  }
  std::ifstream::~ifstream(&ifs);
  return bVar2;
}

Assistant:

bool dofsListFromURDF(const std::string & urdf_filename,
                      std::vector<std::string>& dofs)
{
    std::ifstream ifs(urdf_filename.c_str());

    if( !ifs.is_open() )
    {
        std::cerr << "[ERROR] iDynTree::dofsFromURDF : error opening file "
                  << urdf_filename << std::endl;
        return false;
    }

    std::string xml_string( (std::istreambuf_iterator<char>(ifs) ),
                            (std::istreambuf_iterator<char>()    ) );

    return dofsListFromURDFString(xml_string,dofs);
}